

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

void __thiscall CGL::PathTracer::~PathTracer(PathTracer *this)

{
  long in_RDI;
  vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_> *this_00;
  
  this_00 = *(vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_> **)(in_RDI + 0x90);
  if (this_00 != (vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_> *)0x0) {
    (*(code *)((this_00->super__Vector_base<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>)._M_impl.
               super__Vector_impl_data._M_start)->y)();
  }
  if (*(long **)(in_RDI + 0x98) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x98) + 8))();
  }
  std::vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::~vector
            ((vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_> *)this_00);
  std::vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>::~vector(this_00);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  HDRImageBuffer::~HDRImageBuffer((HDRImageBuffer *)0x128986);
  HDRImageBuffer::~HDRImageBuffer((HDRImageBuffer *)0x128990);
  return;
}

Assistant:

PathTracer::~PathTracer() {
  delete gridSampler;
  delete hemisphereSampler;
}